

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

int glfwGetOSMesaDepthBuffer
              (GLFWwindow *handle,int *width,int *height,int *bytesPerValue,void **buffer)

{
  int iVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  _GLFWwindow *window;
  GLint mesaBytes;
  GLint mesaHeight;
  GLint mesaWidth;
  void *mesaBuffer;
  int local_44;
  int local_40;
  int local_3c;
  void *local_38;
  undefined8 *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  int local_4;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x204) == 0x36003) {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar1 = (*_glfw.osmesa.GetDepthBuffer)
                      (*(OSMesaContext *)(in_RDI + 0x2a8),&local_3c,&local_40,&local_44,&local_38);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"OSMesa: Failed to retrieve depth buffer");
      local_4 = 0;
    }
    else {
      if (local_18 != (int *)0x0) {
        *local_18 = local_3c;
      }
      if (local_20 != (int *)0x0) {
        *local_20 = local_40;
      }
      if (local_28 != (int *)0x0) {
        *local_28 = local_44;
      }
      if (local_30 != (undefined8 *)0x0) {
        *local_30 = local_38;
      }
      local_4 = 1;
    }
  }
  else {
    _glfwInputError(0x1000a,(char *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwGetOSMesaDepthBuffer(GLFWwindow* handle,
                                     int* width, int* height,
                                     int* bytesPerValue,
                                     void** buffer)
{
    void* mesaBuffer;
    GLint mesaWidth, mesaHeight, mesaBytes;
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (window->context.source != GLFW_OSMESA_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return GLFW_FALSE;
    }

    if (!OSMesaGetDepthBuffer(window->context.osmesa.handle,
                              &mesaWidth, &mesaHeight,
                              &mesaBytes, &mesaBuffer))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "OSMesa: Failed to retrieve depth buffer");
        return GLFW_FALSE;
    }

    if (width)
        *width = mesaWidth;
    if (height)
        *height = mesaHeight;
    if (bytesPerValue)
        *bytesPerValue = mesaBytes;
    if (buffer)
        *buffer = mesaBuffer;

    return GLFW_TRUE;
}